

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retFlow.c
# Opt level: O0

Abc_Obj_t * Abc_ObjGetFaninPath(Abc_Obj_t *pObj)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  int local_24;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj_local;
  
  pAVar2 = Abc_ObjGetPath(pObj);
  if (pAVar2 == (Abc_Obj_t *)0x0) {
    __assert_fail("Abc_ObjGetPath(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/ret/retFlow.c"
                  ,0x2e,"Abc_Obj_t *Abc_ObjGetFaninPath(Abc_Obj_t *)");
  }
  local_24 = 0;
  while( true ) {
    iVar1 = Abc_ObjFaninNum(pObj);
    if (iVar1 <= local_24) {
      return (Abc_Obj_t *)0x0;
    }
    pAVar2 = Abc_ObjFanin(pObj,local_24);
    pAVar3 = Abc_ObjGetPath(pAVar2);
    if (pAVar3 == pObj) break;
    local_24 = local_24 + 1;
  }
  return pAVar2;
}

Assistant:

static inline Abc_Obj_t * Abc_ObjGetFaninPath( Abc_Obj_t * pObj ) 
{ 
    Abc_Obj_t * pFanin;
    int i;
    assert( Abc_ObjGetPath(pObj) ); 
    Abc_ObjForEachFanin( pObj, pFanin, i )
        if ( Abc_ObjGetPath(pFanin) == pObj )
            return pFanin;
    return NULL;
}